

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Point_List_Data *in_data)

{
  if (this->data != (Am_Point_List_Data *)0x0) {
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = in_data;
  this->item = (Am_Point_Item *)0x0;
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(Am_Point_List_Data *in_data)
{
  if (data)
    data->Release();
  data = in_data;
  item = nullptr;
  return *this;
}